

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O0

void deblock_edge_luma_hor(pel *src,int stride,int Alpha,int Beta,int edge_flag)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint local_68;
  int local_64;
  int fs;
  int flat_r;
  int flat_l;
  int abs0;
  int R3;
  int R2;
  int R1;
  int R0;
  int L0;
  int L1;
  int L2;
  int L3;
  int inc4;
  int inc3;
  int inc2;
  int inc;
  int line_size;
  int i;
  int edge_flag_local;
  int Beta_local;
  int Alpha_local;
  int stride_local;
  pel *src_local;
  
  inc2 = 8;
  if ((edge_flag & 0x101U) != 0x101) {
    inc2 = 4;
  }
  _Alpha_local = src;
  if ((edge_flag & 1U) == 0) {
    _Alpha_local = src + 4;
  }
  inc = 0;
  while( true ) {
    if (inc2 <= inc) {
      return;
    }
    uVar2 = (uint)_Alpha_local[stride * -2];
    uVar3 = (uint)_Alpha_local[-stride];
    uVar4 = (uint)*_Alpha_local;
    uVar5 = (uint)_Alpha_local[stride];
    iVar6 = uVar4 - uVar3;
    if (iVar6 < 1) {
      iVar6 = -iVar6;
    }
    iVar7 = uVar2 - uVar3;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    fs = 0;
    if (iVar7 < Beta) {
      fs = 2;
    }
    iVar7 = uVar4 - uVar5;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    local_64 = 0;
    if (iVar7 < Beta) {
      local_64 = 2;
    }
    iVar7 = _Alpha_local[stride * -3] - uVar3;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    if (iVar7 < Beta) {
      fs = fs + 1;
    }
    iVar7 = uVar4 - _Alpha_local[stride * 2];
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    if (iVar7 < Beta) {
      local_64 = local_64 + 1;
    }
    switch(fs + -3 + local_64) {
    case 0:
      iVar6 = uVar2 - uVar5;
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      local_68 = (uint)(iVar6 < Beta);
      break;
    case 1:
      local_68 = 1;
      if (fs == 2) {
        local_68 = 2;
      }
      break;
    case 2:
      local_68 = 2;
      if (uVar5 == uVar4 && uVar3 == uVar2) {
        local_68 = 3;
      }
      break;
    case 3:
      iVar7 = uVar4 - uVar5;
      if (iVar7 < 1) {
        iVar7 = -iVar7;
      }
      bVar1 = false;
      if (iVar7 <= Beta / 4) {
        iVar7 = uVar3 - uVar2;
        if (iVar7 < 1) {
          iVar7 = -iVar7;
        }
        bVar1 = false;
        if (iVar7 <= Beta / 4) {
          bVar1 = iVar6 < Alpha;
        }
      }
      local_68 = 3;
      if (bVar1) {
        local_68 = 4;
      }
      break;
    default:
      local_68 = 0;
    }
    if (local_68 - 1 < 4) break;
    inc = inc + 1;
    _Alpha_local = _Alpha_local + 1;
  }
  (*(code *)(&DAT_0032d960 + *(int *)(&DAT_0032d960 + (ulong)(local_68 - 1) * 4)))();
  return;
}

Assistant:

void deblock_edge_luma_hor(pel *src, int stride, int Alpha, int Beta, int edge_flag)
{
    int i, line_size = 8;
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int inc4 = inc + inc3;

    if ((edge_flag & 0x0101) != 0x0101) {
        line_size = 4;
    }
    if (!(edge_flag & 0x1)) {
        src += 4;
    }

    for (i = 0; i < line_size; i++, src++) {
        int L3 = src[-inc4];
        int L2 = src[-inc3];
        int L1 = src[-inc2];
        int L0 = src[-inc];
        int R0 = src[0];
        int R1 = src[inc];
        int R2 = src[inc2];
        int R3 = src[inc3];
        int abs0 = COM_ABS(R0 - L0);
        int flat_l = (COM_ABS(L1 - L0) < Beta) ? 2 : 0;
        int flat_r = (COM_ABS(R0 - R1) < Beta) ? 2 : 0;
        int fs;

        if (COM_ABS(L2 - L0) < Beta) {
            flat_l++;
        }
        if (COM_ABS(R0 - R2) < Beta) {
            flat_r++;
        }

        switch (flat_l + flat_r) {
        case 6:
            fs = (COM_ABS(R0 - R1) <= Beta / 4 && COM_ABS(L0 - L1) <= Beta / 4 && abs0 < Alpha) ? 4 : 3;
            break;
        case 5:
            fs = (R1 == R0 && L0 == L1) ? 3 : 2;
            break;
        case 4:
            fs = (flat_l == 2) ? 2 : 1;
            break;
        case 3:
            fs = (COM_ABS(L1 - R1) < Beta) ? 1 : 0;
            break;
        default:
            fs = 0;
            break;
        }

        switch (fs) {
        case 4:
            src[-inc3] = (pel)((((L3 + L2 + L1) << 1) + L0 + R0 + 4) >> 3);                         //L2
            src[-inc2] = (pel)((((L2 + L0 + L1) << 2) + L1 + R0 * 3 + 8) >> 4);                     //L1
            src[-inc ] = (pel)(((L2 + R1) * 3 + ((L1 + L0 + R0) << 3) + (L0 << 1) + 16) >> 5);      //L0
            src[ 0   ] = (pel)(((R2 + L1) * 3 + ((R1 + R0 + L0) << 3) + (R0 << 1) + 16) >> 5);      //R0
            src[ inc ] = (pel)((((R2 + R1 + R0) << 2) + R1 + L0 * 3 + 8) >> 4);                     //R1
            src[ inc2] = (pel)((((R3 + R2 + R1) << 1) + R0 + L0 + 4) >> 3);                         //R2
            break;
        case 3:
            src[-inc2] = (pel)((L2 * 3 + L1 * 8 + L0 * 4 + R0 + 8) >> 4);                           //L1
            src[-inc ] = (pel)((L2 + (L1 << 2) + (L0 << 2) + (L0 << 1) + (R0 << 2) + R1 + 8) >> 4); //L0
            src[ 0   ] = (pel)((L1 + (L0 << 2) + (R0 << 2) + (R0 << 1) + (R1 << 2) + R2 + 8) >> 4); //R0
            src[ inc ] = (pel)((R2 * 3 + R1 * 8 + R0 * 4 + L0 + 8) >> 4);                           //R2
            break;
        case 2:
            src[-inc] = (pel)(((L1 << 1) + L1 + (L0 << 3) + (L0 << 1) + (R0 << 1) + R0 + 8) >> 4);
            src[0] = (pel)(((L0 << 1) + L0 + (R0 << 3) + (R0 << 1) + (R1 << 1) + R1 + 8) >> 4);
            break;
        case 1:
            src[-inc] = (pel)((L0 * 3 + R0 + 2) >> 2);
            src[0] = (pel)((R0 * 3 + L0 + 2) >> 2);
            break;
        default:
            break;
        }
    }
}